

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O2

entry * libtorrent::anon_unknown_24::build_tracker_list
                  (entry *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *trackers,vector<int,_std::allocator<int>_> *tracker_tiers)

{
  uint uVar1;
  pointer pbVar2;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this_00;
  long lVar3;
  ulong uVar4;
  uint *puVar5;
  string *tr;
  pointer __args;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> local_48;
  
  entry::entry(__return_storage_ptr__);
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
         entry::list(__return_storage_ptr__);
  if ((trackers->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (trackers->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_48.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>(this,&local_48);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&local_48);
    puVar5 = (uint *)(tracker_tiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    pbVar2 = (trackers->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = 0;
    for (__args = (trackers->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args != pbVar2; __args = __args + 1)
    {
      if (puVar5 != (uint *)(tracker_tiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish) {
        uVar1 = *puVar5;
        puVar5 = puVar5 + 1;
        uVar4 = (ulong)uVar1;
        if (0x3ff < uVar1) {
          uVar4 = 0x400;
        }
      }
      lVar3 = *(long *)this;
      if ((ulong)((*(long *)(this + 8) - lVar3) / 0x28) <= uVar4) {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)this,uVar4 + 1);
        lVar3 = *(long *)this;
      }
      this_00 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                entry::list((entry *)(uVar4 * 0x28 + lVar3));
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(this_00,__args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry build_tracker_list(std::vector<std::string> const& trackers
		, std::vector<int> const& tracker_tiers)
	{
		entry ret;
		entry::list_type& tr_list = ret.list();
		if (trackers.empty()) return ret;

		tr_list.emplace_back(entry::list_type());
		std::size_t tier = 0;
		auto tier_it = tracker_tiers.begin();
		for (std::string const& tr : trackers)
		{
			if (tier_it != tracker_tiers.end())
				tier = std::clamp(std::size_t(*tier_it++), std::size_t{0}, std::size_t{1024});

			if (tr_list.size() <= tier)
				tr_list.resize(tier + 1);

			tr_list[tier].list().emplace_back(tr);
		}
		return ret;
	}